

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

int QUtf8::compareUtf8(QByteArrayView lhs,QByteArrayView rhs,CaseSensitivity cs)

{
  uchar uVar1;
  int iVar2;
  char32_t cVar3;
  qsizetype qVar4;
  uchar *__s2;
  size_t sVar5;
  size_t __n;
  uchar *end;
  uchar *__s1;
  size_t sVar6;
  uchar *end_00;
  char32_t ucs4;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  char32_t *output;
  uchar *src2;
  char32_t uc2;
  uchar *src1;
  char32_t uc1;
  char32_t *local_60;
  uchar *local_58;
  char32_t local_4c;
  uchar *local_48;
  char32_t local_3c;
  long local_38;
  
  __s1 = (uchar *)lhs.m_data;
  sVar6 = lhs.m_size;
  __s2 = (uchar *)rhs.m_data;
  sVar5 = rhs.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sVar6 == 0) {
    bVar8 = (long)sVar5 < 0;
    bVar7 = sVar5 == 0;
  }
  else {
    if (cs != CaseSensitive) {
      local_3c = L'\0';
      end_00 = __s1 + sVar6;
      local_4c = L'\0';
      end = __s2 + sVar5;
      local_58 = __s2;
      local_48 = __s1;
      do {
        if ((end_00 <= local_48) || (end <= local_58)) {
          iVar2 = (uint)(local_48 < end_00) - (uint)(local_58 < end);
          break;
        }
        uVar1 = *local_48;
        local_60 = &local_3c;
        local_48 = local_48 + 1;
        qVar4 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                          (uVar1,&local_60,&local_48,end_00);
        if (qVar4 < 0) {
          local_3c = L'�';
        }
        uVar1 = *local_58;
        local_60 = &local_4c;
        local_58 = local_58 + 1;
        qVar4 = QUtf8Functions::fromUtf8<QUtf8BaseTraits,char32_t*,unsigned_char_const*>
                          (uVar1,&local_60,&local_58,end);
        ucs4 = L'�';
        if (-1 < qVar4) {
          ucs4 = local_4c;
        }
        cVar3 = QChar::toCaseFolded(local_3c);
        local_3c = cVar3;
        local_4c = QChar::toCaseFolded(ucs4);
        iVar2 = cVar3 - local_4c;
      } while (cVar3 - local_4c == 0);
      goto LAB_002ff36c;
    }
    __n = sVar6;
    if ((long)sVar5 < (long)sVar6) {
      __n = sVar5;
    }
    iVar2 = memcmp(__s1,__s2,__n);
    if (iVar2 != 0) goto LAB_002ff36c;
    bVar7 = sVar5 == sVar6;
    bVar8 = (long)sVar5 < (long)sVar6;
  }
  iVar2 = (uint)bVar8 * 2 + -1;
  if (bVar7) {
    iVar2 = 0;
  }
LAB_002ff36c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView lhs, QByteArrayView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (lhs.isEmpty())
        return qt_lencmp(0, rhs.size());

    if (cs == Qt::CaseSensitive) {
        const auto l = std::min(lhs.size(), rhs.size());
        int r = memcmp(lhs.data(), rhs.data(), l);
        return r ? r : qt_lencmp(lhs.size(), rhs.size());
    }

    char32_t uc1 = QChar::Null;
    auto src1 = reinterpret_cast<const uchar *>(lhs.data());
    auto end1 = src1 + lhs.size();
    char32_t uc2 = QChar::Null;
    auto src2 = reinterpret_cast<const uchar *>(rhs.data());
    auto end2 = src2 + rhs.size();

    while (src1 < end1 && src2 < end2) {
        uchar b = *src1++;
        char32_t *output = &uc1;
        qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src1, end1);
        if (res < 0) {
            // decoding error
            uc1 = QChar::ReplacementCharacter;
        }

        b = *src2++;
        output = &uc2;
        res = QUtf8Functions::fromUtf8<QUtf8BaseTraits>(b, output, src2, end2);
        if (res < 0) {
            // decoding error
            uc2 = QChar::ReplacementCharacter;
        }

        uc1 = QChar::toCaseFolded(uc1);
        uc2 = QChar::toCaseFolded(uc2);
        if (uc1 != uc2)
            return int(uc1) - int(uc2);
    }

    // the shorter string sorts first
    return (end1 > src1) - (end2 > src2);
}